

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O2

void __thiscall WangLandauSampler::perform_round_trip(WangLandauSampler *this)

{
  Histogram<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  bVar3 = 1;
  do {
    while( true ) {
      (**(this->super_UniformSampler)._vptr_UniformSampler)(this);
      uVar1 = ((this->super_UniformSampler).network)->total_triangles / 3;
      uVar2 = Histogram<unsigned_int>::bin
                        ((this->super_UniformSampler).super_Sampler.histogram,uVar1);
      this_00 = (this->super_UniformSampler).super_Sampler.histogram;
      if (uVar2 != this_00->_bins || bVar3 != 0xff) break;
      bVar3 = 0;
    }
    uVar1 = Histogram<unsigned_int>::bin(this_00,uVar1);
  } while ((bool)(uVar1 != 0 | bVar3));
  return;
}

Assistant:

void perform_round_trip() {
        bool going_up = true;

        while (true) {
            markov_step();
            unsigned int triangles = network.get_triangles();

            // round-trip control
            if (histogram.bin(triangles) == histogram.bins()
                and going_up) {
                going_up = false;
                //std::cout << "reached up\n";
            }
            else if (histogram.bin(triangles) == 0
                     and not going_up) {
                //std::cout << "reached down\n";
                break;
            }
        }
    }